

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::transformVertexClipCoordsToWindowCoords
               (RenderState *state,VertexPacket *packet)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector<float,_4> local_58;
  float local_48;
  float local_44;
  float zf;
  float zn;
  float oY;
  float oX;
  float halfH;
  float halfW;
  WindowRectangle *viewport;
  float local_20 [2];
  VertexPacket *local_18;
  VertexPacket *packet_local;
  RenderState *state_local;
  
  local_18 = packet;
  packet_local = (VertexPacket *)state;
  pfVar3 = tcu::Vector<float,_4>::x(&packet->position);
  fVar1 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::w(&local_18->position);
  fVar4 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::y(&local_18->position);
  fVar5 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::w(&local_18->position);
  fVar6 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::z(&local_18->position);
  fVar7 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::w(&local_18->position);
  fVar2 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::w(&local_18->position);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&viewport,fVar1 / fVar4,fVar5 / fVar6,fVar7 / fVar2,1.0 / *pfVar3);
  *(WindowRectangle **)(local_18->position).m_data = viewport;
  *(float (*) [2])((local_18->position).m_data + 2) = local_20;
  _halfH = packet_local[3].outputs[0].v.iData + 3;
  oX = (float)packet_local[4].vertexNdx / 2.0;
  oY = (float)(int)packet_local[4].position.m_data[0] / 2.0;
  zn = (float)*_halfH + oX;
  zf = (float)packet_local[4].instanceNdx + oY;
  local_44 = packet_local[4].position.m_data[1];
  local_48 = packet_local[4].position.m_data[2];
  pfVar3 = tcu::Vector<float,_4>::x(&local_18->position);
  fVar4 = *pfVar3 * oX + zn;
  pfVar3 = tcu::Vector<float,_4>::y(&local_18->position);
  fVar5 = *pfVar3 * oY + zf;
  pfVar3 = tcu::Vector<float,_4>::z(&local_18->position);
  fVar1 = *pfVar3;
  fVar6 = local_48 - local_44;
  fVar7 = local_44 + local_48;
  pfVar3 = tcu::Vector<float,_4>::w(&local_18->position);
  tcu::Vector<float,_4>::Vector(&local_58,fVar4,fVar5,(fVar1 * fVar6) / 2.0 + fVar7 / 2.0,*pfVar3);
  *(undefined8 *)(local_18->position).m_data = local_58.m_data._0_8_;
  *(undefined8 *)((local_18->position).m_data + 2) = local_58.m_data._8_8_;
  return;
}

Assistant:

void transformVertexClipCoordsToWindowCoords (const RenderState& state, VertexPacket& packet)
{
	// To normalized device coords
	{
		packet.position = tcu::Vec4(packet.position.x()/packet.position.w(),
									packet.position.y()/packet.position.w(),
									packet.position.z()/packet.position.w(),
									1.0f               /packet.position.w());
	}

	// To window coords
	{
		const WindowRectangle&	viewport	= state.viewport.rect;
		const float				halfW		= (float)(viewport.width) / 2.0f;
		const float				halfH		= (float)(viewport.height) / 2.0f;
		const float				oX			= (float)viewport.left + halfW;
		const float				oY			= (float)viewport.bottom + halfH;
		const float				zn			= state.viewport.zn;
		const float				zf			= state.viewport.zf;

		packet.position = tcu::Vec4(packet.position.x()*halfW + oX,
									packet.position.y()*halfH + oY,
									packet.position.z()*(zf - zn)/2.0f + (zn + zf)/2.0f,
									packet.position.w());
	}
}